

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

double __thiscall
gmlc::utilities::numeric_conversionComplete<double>(utilities *this,string_view V,double defValue)

{
  int iVar1;
  utilities *puVar2;
  string_view input;
  size_t rem;
  double local_30;
  utilities *local_28;
  double local_20;
  
  input._M_len = (byte *)V._M_len;
  local_30 = defValue;
  if ((((this != (utilities *)0x0) && (numCheck[*input._M_len] == '\x01')) &&
      (numCheckEnd[(input._M_len + -1)[(long)this]] == '\x01')) &&
     (input._M_str = (char *)&local_28,
     local_30 = strViewToFloat<double>(this,input,(size_t *)numCheckEnd), local_20 = local_30,
     local_28 < this)) {
    do {
      puVar2 = local_28 + 1;
      iVar1 = isspace((int)(char)(input._M_len + -1)[(long)puVar2]);
      if (iVar1 == 0) {
        return defValue;
      }
      local_30 = local_20;
      local_28 = puVar2;
    } while (puVar2 != this);
  }
  return local_30;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}